

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

int AF_AActor_LineAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  int iVar2;
  FTranslatedLineTarget *victim;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClassActor *pufftype;
  AActor *pAVar6;
  PClassActor *pPVar7;
  char *pcVar8;
  int flags;
  bool bVar9;
  double distance;
  int acdmg;
  void *local_60;
  void *local_58;
  double local_50;
  FName local_44;
  DAngle local_40;
  DAngle local_38;
  PClass *pPVar5;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_00417247;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0041720c:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00417247:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11db,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar6 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar6 == (AActor *)0x0) goto LAB_00416fde;
    pPVar5 = (pAVar6->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (pAVar6->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar9 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar9) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00417247;
    }
  }
  else {
    if (pAVar6 != (AActor *)0x0) goto LAB_0041720c;
LAB_00416fde:
    pAVar6 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar8 = "(paramnum) < numparam";
LAB_0041726f:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11dc,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar8 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_0041726f;
  }
  if (numparam < 3) {
    pcVar8 = "(paramnum) < numparam";
LAB_00417297:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11dd,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar8 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_00417297;
  }
  if (numparam == 3) {
    pcVar8 = "(paramnum) < numparam";
LAB_004172bf:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11de,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    pcVar8 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_004172bf;
  }
  if ((uint)numparam < 5) {
    pcVar8 = "(paramnum) < numparam";
LAB_004172e7:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11df,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_004172e7;
  }
  if (numparam == 5) {
    pcVar8 = "(paramnum) < numparam";
LAB_0041730f:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11e0,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[5].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_0041730f;
  }
  if ((uint)numparam < 7) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_0041732e;
  }
  if (param[6].field_0.field_3.Type != '\x03') {
LAB_00417215:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0041732e:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11e1,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  local_38.Degrees = (double)param[1].field_0.field_1.a;
  pVVar1 = param + 2;
  local_40.Degrees = (double)param[3].field_0.field_1.a;
  iVar4 = param[4].field_0.i;
  iVar2 = param[5].field_0.i;
  pufftype = (PClassActor *)param[6].field_0.field_1.a;
  if (param[6].field_0.field_1.atag == 1) {
    if (pufftype == (PClassActor *)0x0) goto LAB_004170ce;
    pPVar7 = pufftype;
    if (pufftype != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
        if (pPVar7 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar7 != (PClassActor *)0x0);
      if (pPVar7 == (PClassActor *)0x0) {
        pcVar8 = "puffType == NULL || puffType->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_0041732e;
      }
    }
    bVar9 = false;
  }
  else {
    if (pufftype != (PClassActor *)0x0) goto LAB_00417215;
LAB_004170ce:
    bVar9 = true;
    pufftype = (PClassActor *)0x0;
  }
  if (numparam == 7) {
    param = defaultparam->Array;
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00417356:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x11e2,
                    "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    flags = param[7].field_0.i;
  }
  else {
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_00417356;
    }
    flags = param[7].field_0.i;
    if (8 < numparam) {
      if ((param[8].field_0.field_3.Type != '\x03') || (param[8].field_0.field_1.atag != 0)) {
        pcVar8 = "(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC";
        goto LAB_00417228;
      }
      goto LAB_00417147;
    }
    param = defaultparam->Array;
  }
  if ((param[8].field_0.field_3.Type != '\x03') || (param[8].field_0.field_1.atag != 0)) {
    pcVar8 = 
    "(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
    ;
LAB_00417228:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11e3,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_00417147:
  victim = (FTranslatedLineTarget *)param[8].field_0.field_1.a;
  distance = (pVVar1->field_0).f;
  if (bVar9) {
    local_60 = (void *)local_40.Degrees;
    local_58 = (void *)local_38.Degrees;
    local_50 = (pVVar1->field_0).f;
    pufftype = PClass::FindActor("BulletPuff");
    distance = local_50;
    local_38.Degrees = (double)local_58;
    local_40.Degrees = (double)local_60;
  }
  local_44.Index = iVar2;
  pAVar6 = P_LineAttack(pAVar6,&local_38,distance,&local_40,iVar4,&local_44,pufftype,flags,victim,
                        &acdmg);
  if (0 < numret) {
    VMReturn::SetPointer(ret,pAVar6,1);
    bVar9 = numret != 1;
    numret = 1;
    if (bVar9) {
      if (ret[1].RegType != '\0') {
        __assert_fail("RegType == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                      ,0x13f,"void VMReturn::SetInt(int)");
      }
      *(int *)ret[1].Location = acdmg;
      numret = 2;
    }
  }
  return numret;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, LineAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE(angle);
	PARAM_FLOAT(distance);
	PARAM_ANGLE(pitch);
	PARAM_INT(damage);
	PARAM_NAME(damageType);
	PARAM_CLASS(puffType, AActor);
	PARAM_INT_DEF(flags);
	PARAM_POINTER_DEF(victim, FTranslatedLineTarget);

	int acdmg;
	if (puffType == nullptr) puffType = PClass::FindActor("BulletPuff");	// P_LineAttack does not work without a puff to take info from.
	auto puff = P_LineAttack(self, angle, distance, pitch, damage, damageType, puffType, flags, victim, &acdmg);
	if (numret > 0) ret[0].SetPointer(puff, ATAG_OBJECT);
	if (numret > 1) ret[1].SetInt(acdmg), numret = 2;
	return numret;
}